

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O2

int xcb_input_feedback_state_data_serialize
              (void **_buffer,uint8_t class_id,xcb_input_feedback_state_data_t *_aux)

{
  long lVar1;
  void *__src;
  size_t __n;
  iovec *piVar2;
  uint uVar3;
  size_t *psVar4;
  void *__dest;
  int iVar5;
  int iVar6;
  undefined7 in_register_00000031;
  ulong uVar7;
  uint uVar8;
  long in_FS_OFFSET;
  size_t sStack_1f0;
  uint local_1e0;
  char xcb_pad0 [3];
  iovec xcb_parts [27];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __dest = *_buffer;
  xcb_pad0[2] = '\0';
  xcb_pad0[0] = '\0';
  xcb_pad0[1] = '\0';
  memset(xcb_parts,0xaa,0x1b0);
  switch(CONCAT71(in_register_00000031,class_id) & 0xffffffff) {
  case 0:
    psVar4 = &xcb_parts[8].iov_len;
    xcb_parts[0].iov_base = _aux;
    xcb_parts[0].iov_len = 2;
    xcb_parts[1].iov_base = &(_aux->keyboard).duration;
    xcb_parts[1].iov_len = 2;
    xcb_parts[2].iov_base = &(_aux->keyboard).led_mask;
    xcb_parts[2].iov_len = 4;
    xcb_parts[3].iov_base = &(_aux->keyboard).led_values;
    xcb_parts[3].iov_len = 4;
    xcb_parts[4].iov_base = &(_aux->keyboard).global_auto_repeat;
    xcb_parts[4].iov_len = 1;
    xcb_parts[5].iov_base = &(_aux->keyboard).click;
    xcb_parts[5].iov_len = 1;
    xcb_parts[6].iov_base = &(_aux->keyboard).percent;
    xcb_parts[6].iov_len = 1;
    xcb_parts[7].iov_base = &local_1e0;
    xcb_parts[7].iov_len = 1;
    xcb_parts[8].iov_base = (_aux->keyboard).auto_repeats;
    iVar5 = 0x30;
    uVar8 = 9;
    iVar6 = 0;
    sStack_1f0 = 0x20;
    uVar3 = 0;
    break;
  case 1:
    psVar4 = &xcb_parts[3].iov_len;
    xcb_parts[0].iov_base = xcb_pad0;
    sStack_1f0 = 2;
    xcb_parts[0].iov_len = 2;
    xcb_parts[1].iov_base = &(_aux->pointer).accel_num;
    xcb_parts[1].iov_len = 2;
    xcb_parts[2].iov_base = &(_aux->pointer).accel_denom;
    xcb_parts[2].iov_len = 2;
    xcb_parts[3].iov_base = &(_aux->pointer).threshold;
    iVar5 = 8;
    uVar8 = 4;
    uVar3 = 1;
    iVar6 = 0;
    break;
  case 2:
    psVar4 = &xcb_parts[2].iov_len;
    xcb_parts[0].iov_base = &_aux->string;
    xcb_parts[0].iov_len = 2;
    xcb_parts[1].iov_base = &(_aux->string).num_keysyms;
    xcb_parts[1].iov_len = 2;
    xcb_parts[2].iov_base = (_aux->string).keysyms;
    sStack_1f0 = (ulong)(_aux->string).num_keysyms << 2;
    iVar5 = (int)sStack_1f0;
    uVar3 = 3;
    iVar6 = 4;
    uVar8 = uVar3;
    break;
  case 3:
    psVar4 = &xcb_parts[2].iov_len;
    xcb_parts[0].iov_base = &_aux->integer;
    sStack_1f0 = 4;
    xcb_parts[0].iov_len = 4;
    xcb_parts[1].iov_base = &(_aux->integer).min_value;
    xcb_parts[1].iov_len = 4;
    xcb_parts[2].iov_base = &(_aux->integer).max_value;
    iVar5 = 0xc;
    uVar3 = 3;
    iVar6 = 0;
    uVar8 = uVar3;
    break;
  case 4:
    piVar2 = xcb_parts + 1;
    xcb_parts[0].iov_base = &_aux->led;
    xcb_parts[0].iov_len = 4;
    xcb_parts[1].iov_base = &(_aux->led).led_values;
    uVar8 = 2;
    uVar3 = 3;
    sStack_1f0 = 4;
    goto LAB_0017d4c9;
  case 5:
    piVar2 = xcb_parts + 3;
    xcb_parts[0].iov_base = &_aux->bell;
    xcb_parts[0].iov_len = 1;
    xcb_parts[1].iov_base = xcb_pad0;
    xcb_parts[1].iov_len = 3;
    xcb_parts[2].iov_base = &(_aux->bell).pitch;
    xcb_parts[2].iov_len = 2;
    xcb_parts[3].iov_base = &(_aux->bell).duration;
    uVar8 = 4;
    uVar3 = 1;
    sStack_1f0 = 2;
LAB_0017d4c9:
    psVar4 = &piVar2->iov_len;
    iVar5 = 8;
    iVar6 = 0;
    break;
  default:
    uVar3 = 0xffffffff;
    iVar6 = 0;
    uVar8 = 0;
    iVar5 = 0;
    goto LAB_0017d4cd;
  }
  *psVar4 = sStack_1f0;
LAB_0017d4cd:
  uVar3 = -iVar5 & uVar3;
  local_1e0 = uVar3;
  if (uVar3 != 0) {
    *(char **)((long)&xcb_parts[0].iov_base + (ulong)(uVar8 << 4)) = xcb_pad0;
    *(ulong *)((long)&xcb_parts[0].iov_len + (ulong)(uVar8 << 4)) = (ulong)uVar3;
    uVar8 = uVar8 + 1;
    local_1e0 = 0;
  }
  uVar3 = iVar6 + iVar5 + uVar3;
  if (__dest == (void *)0x0) {
    __dest = malloc((ulong)uVar3);
    *_buffer = __dest;
  }
  for (uVar7 = 0; uVar8 << 4 != uVar7; uVar7 = uVar7 + 0x10) {
    __src = *(void **)((long)&xcb_parts[0].iov_base + uVar7);
    if ((__src != (void *)0x0) && (__n = *(size_t *)((long)&xcb_parts[0].iov_len + uVar7), __n != 0)
       ) {
      memcpy(__dest,__src,__n);
    }
    __dest = (void *)((long)__dest + *(long *)((long)&xcb_parts[0].iov_len + uVar7));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return uVar3;
}

Assistant:

int
xcb_input_feedback_state_data_serialize (void                                  **_buffer,
                                         uint8_t                                 class_id,
                                         const xcb_input_feedback_state_data_t  *_aux)
{
    char *xcb_out = *_buffer;
    unsigned int xcb_buffer_len = 0;
    unsigned int xcb_align_to = 0;
    unsigned int xcb_padding_offset = 0;

    unsigned int xcb_pad = 0;
    char xcb_pad0[3] = {0, 0, 0};
    struct iovec xcb_parts[27];
    unsigned int xcb_parts_idx = 0;
    unsigned int xcb_block_len = 0;
    unsigned int i;
    char *xcb_tmp;

    if(class_id == XCB_INPUT_FEEDBACK_CLASS_KEYBOARD) {
        /* xcb_input_feedback_state_data_t.keyboard.pitch */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.pitch;
        xcb_block_len += sizeof(uint16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint16_t);
        /* xcb_input_feedback_state_data_t.keyboard.duration */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.duration;
        xcb_block_len += sizeof(uint16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint16_t);
        /* xcb_input_feedback_state_data_t.keyboard.led_mask */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.led_mask;
        xcb_block_len += sizeof(uint32_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint32_t);
        /* xcb_input_feedback_state_data_t.keyboard.led_values */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.led_values;
        xcb_block_len += sizeof(uint32_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint32_t);
        /* xcb_input_feedback_state_data_t.keyboard.global_auto_repeat */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.global_auto_repeat;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_feedback_state_data_t.keyboard.click */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.click;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_feedback_state_data_t.keyboard.percent */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.percent;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_feedback_state_data_t.keyboard.pad0 */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &xcb_pad;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_feedback_state_data_t.keyboard.auto_repeats */
        xcb_parts[xcb_parts_idx].iov_base = (char *) _aux->keyboard.auto_repeats;
        xcb_block_len += 32;
        xcb_parts[xcb_parts_idx].iov_len = 32;
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
    }
    if(class_id == XCB_INPUT_FEEDBACK_CLASS_POINTER) {
        /* xcb_input_feedback_state_data_t.pointer.pad1 */
        xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
        xcb_block_len += sizeof(uint8_t)*2;
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t)*2;
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_feedback_state_data_t.pointer.accel_num */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->pointer.accel_num;
        xcb_block_len += sizeof(uint16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint16_t);
        /* xcb_input_feedback_state_data_t.pointer.accel_denom */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->pointer.accel_denom;
        xcb_block_len += sizeof(uint16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint16_t);
        /* xcb_input_feedback_state_data_t.pointer.threshold */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->pointer.threshold;
        xcb_block_len += sizeof(uint16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint16_t);
    }
    if(class_id == XCB_INPUT_FEEDBACK_CLASS_STRING) {
        /* xcb_input_feedback_state_data_t.string.max_symbols */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->string.max_symbols;
        xcb_block_len += sizeof(uint16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint16_t);
        /* xcb_input_feedback_state_data_t.string.num_keysyms */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->string.num_keysyms;
        xcb_block_len += sizeof(uint16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint16_t);
        /* insert padding */
        xcb_pad = -(xcb_block_len + xcb_padding_offset) & (xcb_align_to - 1);
        xcb_buffer_len += xcb_block_len + xcb_pad;
        if (0 != xcb_pad) {
            xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
            xcb_parts[xcb_parts_idx].iov_len = xcb_pad;
            xcb_parts_idx++;
            xcb_pad = 0;
        }
        xcb_block_len = 0;
        xcb_padding_offset = 0;
        /* keysyms */
        xcb_parts[xcb_parts_idx].iov_base = (char *) _aux->string.keysyms;
        xcb_block_len += _aux->string.num_keysyms * sizeof(uint32_t);
        xcb_parts[xcb_parts_idx].iov_len = _aux->string.num_keysyms * sizeof(uint32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(xcb_keysym_t);
    }
    if(class_id == XCB_INPUT_FEEDBACK_CLASS_INTEGER) {
        /* xcb_input_feedback_state_data_t.integer.resolution */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->integer.resolution;
        xcb_block_len += sizeof(uint32_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint32_t);
        /* xcb_input_feedback_state_data_t.integer.min_value */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->integer.min_value;
        xcb_block_len += sizeof(int32_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(int32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int32_t);
        /* xcb_input_feedback_state_data_t.integer.max_value */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->integer.max_value;
        xcb_block_len += sizeof(int32_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(int32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int32_t);
    }
    if(class_id == XCB_INPUT_FEEDBACK_CLASS_LED) {
        /* xcb_input_feedback_state_data_t.led.led_mask */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->led.led_mask;
        xcb_block_len += sizeof(uint32_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint32_t);
        /* xcb_input_feedback_state_data_t.led.led_values */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->led.led_values;
        xcb_block_len += sizeof(uint32_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint32_t);
    }
    if(class_id == XCB_INPUT_FEEDBACK_CLASS_BELL) {
        /* xcb_input_feedback_state_data_t.bell.percent */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->bell.percent;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_feedback_state_data_t.bell.pad2 */
        xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
        xcb_block_len += sizeof(uint8_t)*3;
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t)*3;
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_feedback_state_data_t.bell.pitch */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->bell.pitch;
        xcb_block_len += sizeof(uint16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint16_t);
        /* xcb_input_feedback_state_data_t.bell.duration */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->bell.duration;
        xcb_block_len += sizeof(uint16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint16_t);
    }
    /* insert padding */
    xcb_pad = -(xcb_block_len + xcb_padding_offset) & (xcb_align_to - 1);
    xcb_buffer_len += xcb_block_len + xcb_pad;
    if (0 != xcb_pad) {
        xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
        xcb_parts[xcb_parts_idx].iov_len = xcb_pad;
        xcb_parts_idx++;
        xcb_pad = 0;
    }
    xcb_block_len = 0;
    xcb_padding_offset = 0;

    if (NULL == xcb_out) {
        /* allocate memory */
        xcb_out = malloc(xcb_buffer_len);
        *_buffer = xcb_out;
    }

    xcb_tmp = xcb_out;
    for(i=0; i<xcb_parts_idx; i++) {
        if (0 != xcb_parts[i].iov_base && 0 != xcb_parts[i].iov_len)
            memcpy(xcb_tmp, xcb_parts[i].iov_base, xcb_parts[i].iov_len);
        if (0 != xcb_parts[i].iov_len)
            xcb_tmp += xcb_parts[i].iov_len;
    }

    return xcb_buffer_len;
}